

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscReaderGeneric.cpp
# Opt level: O0

vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
* __thiscall
adios2::core::engine::ssc::SscReaderGeneric::BlocksInfo
          (SscReaderGeneric *this,VariableStruct *variable,size_t step)

{
  bool bVar1;
  __type _Var2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000010;
  value_type *b;
  BlockInfo *v;
  const_iterator __end4;
  const_iterator __begin4;
  value_type *__range4;
  int i;
  size_t blockID;
  vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  *ret;
  vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
  *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int iVar4;
  reference in_stack_ffffffffffffff90;
  __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
  local_48;
  const_reference local_40;
  int local_34;
  size_t local_30;
  undefined1 local_21;
  
  local_21 = 0;
  std::
  vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
  ::vector((vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
            *)0x1e6ba8);
  local_30 = 0;
  local_34 = 0;
  while (iVar4 = local_34,
        sVar3 = std::
                vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                ::size((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                        *)&in_RSI[9].field_2), iVar4 < (int)sVar3) {
    local_40 = std::
               vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
               ::operator[]((vector<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                             *)&in_RSI[9].field_2,(long)local_34);
    local_48._M_current =
         (BlockInfo *)
         std::
         vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
         ::begin(in_stack_ffffffffffffff68);
    std::
    vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>
    ::end(in_stack_ffffffffffffff68);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)CONCAT44(iVar4,in_stack_ffffffffffffff70),
                              (__normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
                               *)in_stack_ffffffffffffff68), bVar1) {
      __gnu_cxx::
      __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
      ::operator*(&local_48);
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_ffffffffffffff90,in_RSI);
      if (_Var2) {
        std::
        vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
        ::emplace_back<>((vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                          *)CONCAT44(iVar4,in_stack_ffffffffffffff70));
        in_stack_ffffffffffffff90 =
             std::
             vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
             ::back((vector<adios2::core::VariableStruct::BPInfo,_std::allocator<adios2::core::VariableStruct::BPInfo>_>
                     *)CONCAT44(iVar4,in_stack_ffffffffffffff70));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_00000010,in_stack_00000008);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_00000010,in_stack_00000008);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                  (in_stack_00000010,in_stack_00000008);
        in_stack_ffffffffffffff90->Step = in_RSI[4]._M_string_length;
        in_stack_ffffffffffffff90->StepsStart = in_RSI[4]._M_string_length;
        in_stack_ffffffffffffff90->StepsCount = 1;
        in_stack_ffffffffffffff90->WriterID = local_34;
        in_stack_ffffffffffffff90->BlockID = local_30;
        if (*(int *)(*(long *)(in_RSI + 6) + 0x58) != 0) {
          in_stack_ffffffffffffff90->IsReverseDims = true;
        }
        local_30 = local_30 + 1;
      }
      __gnu_cxx::
      __normal_iterator<const_adios2::core::engine::ssc::BlockInfo_*,_std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>
      ::operator++(&local_48);
    }
    local_34 = local_34 + 1;
  }
  return in_RDI;
}

Assistant:

std::vector<VariableStruct::BPInfo> SscReaderGeneric::BlocksInfo(const VariableStruct &variable,
                                                                 const size_t step) const
{
    std::vector<VariableStruct::BPInfo> ret;
    size_t blockID = 0;
    for (int i = 0; i < static_cast<int>(m_GlobalWritePattern.size()); ++i)
    {
        for (auto &v : m_GlobalWritePattern[i])
        {
            if (v.name == variable.m_Name)
            {
                ret.emplace_back();
                auto &b = ret.back();
                b.Start = v.start;
                b.Count = v.count;
                b.Shape = v.shape;
                b.Step = m_CurrentStep;
                b.StepsStart = m_CurrentStep;
                b.StepsCount = 1;
                b.WriterID = i;
                b.BlockID = blockID;
                if (m_IO.m_ArrayOrder != ArrayOrdering::RowMajor)
                {
                    b.IsReverseDims = true;
                }
                ++blockID;
            }
        }
    }
    return ret;
}